

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O0

RelocList *
elf_newreloclist(size_t relasize,size_t writesize,
                _func_void_void_ptr_uint64_t_uint64_t_uint32_t_uint32_t_bool *initfunc)

{
  RelocList *l;
  _func_void_void_ptr_uint64_t_uint64_t_uint32_t_uint32_t_bool *in_RDX;
  size_t in_RSI;
  size_t in_RDI;
  RelocList *rl;
  size_t in_stack_ffffffffffffffe0;
  
  l = (RelocList *)alloc(in_stack_ffffffffffffffe0);
  initlist((list *)l);
  l->relasize = in_RDI;
  l->writesize = in_RSI;
  l->initreloc = in_RDX;
  return l;
}

Assistant:

struct RelocList *elf_newreloclist(size_t relasize,size_t writesize,
                                   void (*initfunc)(void *,uint64_t,uint64_t,
                                                    uint32_t,uint32_t,bool))
{
  struct RelocList *rl = alloc(sizeof(struct RelocList));

  initlist(&rl->l);
  rl->relasize = relasize;
  rl->writesize = writesize;
  rl->initreloc = initfunc;
  return rl;
}